

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

int z80GetRegister8(char *source,int *RetLen)

{
  short sVar1;
  int iVar2;
  char *__s1;
  long lVar3;
  
  __s1 = "b";
  lVar3 = 0;
  while( true ) {
    sVar1 = *(short *)((long)&Z80Registers8[0].len + lVar3);
    iVar2 = strncmp(__s1,source,(long)sVar1);
    if (((iVar2 == 0) && ((ulong)(byte)source[sVar1] < 0x2d)) &&
       ((0x120000000001U >> ((ulong)(byte)source[sVar1] & 0x3f) & 1) != 0)) break;
    __s1 = *(char **)((long)&Z80Registers8[1].name + lVar3);
    lVar3 = lVar3 + 0x10;
    if (lVar3 == 0x80) {
      return -1;
    }
  }
  *RetLen = (int)sVar1;
  return (int)*(short *)((long)&Z80Registers8[0].num + lVar3);
}

Assistant:

int z80GetRegister8(char* source, int& RetLen)
{
	for (int z = 0; Z80Registers8[z].name != NULL; z++)
	{
		int len = Z80Registers8[z].len;
		if (strncmp(Z80Registers8[z].name,source,len) == 0)
		{
			switch (source[len])
			{
			case ')': case ',': case 0:
				RetLen = len;
				return Z80Registers8[z].num;
			default:
				break;
			}
		}
	}
	return -1;
}